

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

TabPosition __thiscall QMainWindowLayout::tabPosition(QMainWindowLayout *this,DockWidgetArea area)

{
  DockPosition DVar1;
  DockWidgetArea in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  DockPosition dockPos;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  TabPosition local_2c;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DVar1 = toDockPos(in_ESI);
  if ((int)DVar1 < 4) {
    local_2c = *(TabPosition *)(in_RDI + (ulong)DVar1 * 4 + 0x764);
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_ESI,DVar1),in_RDI,in_stack_ffffffffffffffb4,
               in_stack_ffffffffffffffa8);
    QMessageLogger::warning
              (local_28,"QMainWindowLayout::tabPosition called with out-of-bounds value \'%d\'",
               (ulong)in_ESI);
    local_2c = North;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

QTabWidget::TabPosition QMainWindowLayout::tabPosition(Qt::DockWidgetArea area) const
{
    const QInternal::DockPosition dockPos = toDockPos(area);
    if (dockPos < QInternal::DockCount)
        return tabPositions[dockPos];
    qWarning("QMainWindowLayout::tabPosition called with out-of-bounds value '%d'", int(area));
    return QTabWidget::North;
}